

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Totals * __thiscall Catch::Totals::operator-(Totals *this,Totals *other)

{
  Totals *in_RDI;
  Totals *diff;
  Totals *other_00;
  Counts *in_stack_ffffffffffffffb0;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  
  other_00 = in_RDI;
  Totals(in_RDI);
  Counts::operator-(in_stack_ffffffffffffffb0,&other_00->assertions);
  (in_RDI->assertions).passed = local_30;
  (in_RDI->assertions).failed = local_28;
  (in_RDI->assertions).failedButOk = local_20;
  (in_RDI->assertions).skipped = local_18;
  Counts::operator-(in_stack_ffffffffffffffb0,&other_00->assertions);
  (in_RDI->testCases).passed = (uint64_t)in_stack_ffffffffffffffb0;
  (in_RDI->testCases).failed = local_48;
  (in_RDI->testCases).failedButOk = local_40;
  (in_RDI->testCases).skipped = local_38;
  return other_00;
}

Assistant:

Totals Totals::operator - ( Totals const& other ) const {
        Totals diff;
        diff.assertions = assertions - other.assertions;
        diff.testCases = testCases - other.testCases;
        return diff;
    }